

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadThings(MapData *map)

{
  double *pdVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  FMapThing *pFVar5;
  WORD WVar6;
  DWORD DVar7;
  uint amount;
  FMapThing *buffer;
  FMapThing *pFVar8;
  FDoomEdEntry *pFVar9;
  long lVar10;
  ushort local_36;
  int local_34;
  short flags;
  int i;
  FMapThing *mti;
  mapthing_t *mt;
  char *mtp;
  int numthings;
  int lumplen;
  MapData *map_local;
  
  DVar7 = MapData::Size(map,1);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)DVar7;
  amount = SUB164(auVar4 / ZEXT816(10),0);
  buffer = (FMapThing *)operator_new__((long)(int)DVar7);
  MapData::Read(map,1,buffer,-1);
  TArray<FMapThing,_FMapThing>::Resize(&MapThingsConverted,amount);
  pFVar8 = TArray<FMapThing,_FMapThing>::operator[](&MapThingsConverted,0);
  mti = buffer;
  for (local_34 = 0; local_34 < (int)amount; local_34 = local_34 + 1) {
    uVar3 = *(ushort *)&(mti->pos).X;
    lVar10 = (long)local_34;
    pFVar5 = pFVar8 + lVar10;
    pFVar5->pitch = 0;
    pFVar5->roll = 0;
    pFVar5->RenderStyle = 0;
    *(undefined8 *)(&pFVar5->pitch + 4) = 0;
    pdVar1 = &pFVar8[lVar10].Scale.Y;
    *pdVar1 = 0.0;
    pdVar1[1] = 0.0;
    *(undefined8 *)&pFVar8[lVar10].fillcolor = 0;
    ((DVector2 *)(&pFVar8[lVar10].fillcolor + 2))->X = 0.0;
    pFVar8[lVar10].Gravity = 0.0;
    (&pFVar8[lVar10].Gravity)[1] = 0.0;
    piVar2 = pFVar8[lVar10].args + 2;
    piVar2[0] = 0;
    piVar2[1] = 0;
    *(undefined8 *)(piVar2 + 2) = 0;
    pFVar5 = pFVar8 + lVar10;
    pFVar5->flags = 0;
    pFVar5->special = 0;
    (&pFVar5->flags + 2)[0] = 0;
    (&pFVar5->flags + 2)[1] = 0;
    pFVar5 = pFVar8 + lVar10;
    pFVar5->angle = 0;
    pFVar5->SkillFilter = 0;
    pFVar5->ClassFilter = 0;
    pFVar5->EdNum = 0;
    *(FDoomEdEntry **)(&pFVar5->angle + 4) = (FDoomEdEntry *)0x0;
    pdVar1 = &pFVar8[lVar10].pos.Y;
    *pdVar1 = 0.0;
    pdVar1[1] = 0.0;
    *(undefined8 *)(pFVar8 + lVar10) = 0;
    pFVar8[lVar10].pos.X = 0.0;
    pFVar8[local_34].Gravity = 1.0;
    pFVar8[local_34].Conversation = 0;
    WVar6 = MakeSkill((int)(short)uVar3);
    pFVar8[local_34].SkillFilter = WVar6;
    pFVar8[local_34].ClassFilter = 0xffff;
    pFVar8[local_34].RenderStyle = 0xe;
    pFVar8[local_34].Alpha = -1.0;
    pFVar8[local_34].health = 1;
    pFVar8[local_34].FloatbobPhase = -1;
    pFVar8[local_34].pos.X = (double)(int)(short)mti->thingid;
    pFVar8[local_34].pos.Y = (double)(int)*(short *)((long)&mti->thingid + 2);
    pFVar8[local_34].angle = *(short *)&mti->field_0x4;
    pFVar8[local_34].EdNum = *(short *)&mti->field_0x6;
    pFVar9 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                       (&DoomEdMap,(int)pFVar8[local_34].EdNum);
    pFVar8[local_34].info = pFVar9;
    if ((pFVar8[local_34].info == (FDoomEdEntry *)0x0) || ((pFVar8[local_34].info)->Special != 0x19)
       ) {
      local_36 = uVar3 & 0xfff8;
      pFVar8[local_34].flags = (int)(short)(uVar3 & 8 | 0x7e0);
      if (gameinfo.gametype == GAME_Strife) {
        pFVar8[local_34].flags = pFVar8[local_34].flags & 0xfffffff7;
        if ((uVar3 & 0x100) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 0x800;
        }
        if ((uVar3 & 0x200) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 0x1000;
        }
        if ((uVar3 & 8) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 0x4000;
        }
        if ((uVar3 & 0x20) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 8;
        }
        if ((uVar3 & 0x40) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 0x2000;
        }
      }
      else {
        if ((uVar3 & 0x100) != 0) {
          local_36 = uVar3 & 0x18;
        }
        if ((local_36 & 0x20) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags & 0xfffffbff;
        }
        if ((local_36 & 0x40) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags & 0xfffffdff;
        }
        if ((local_36 & 0x80) != 0) {
          pFVar8[local_34].flags = pFVar8[local_34].flags | 0x2000;
        }
      }
      if ((local_36 & 0x10) != 0) {
        pFVar8[local_34].flags = pFVar8[local_34].flags & 0xfffffeff;
      }
    }
    else {
      ProcessEDMapthing(pFVar8 + local_34,(int)(short)uVar3);
    }
    mti = (FMapThing *)((long)&(mti->pos).X + 2);
  }
  if (buffer != (FMapThing *)0x0) {
    operator_delete__(buffer);
  }
  return;
}

Assistant:

void P_LoadThings (MapData * map)
{
	int	lumplen = map->Size(ML_THINGS);
	int numthings = lumplen / sizeof(mapthing_t);

	char *mtp;
	mapthing_t *mt;

	mtp = new char[lumplen];
	map->Read(ML_THINGS, mtp);
	mt = (mapthing_t*)mtp;

	MapThingsConverted.Resize(numthings);
	FMapThing *mti = &MapThingsConverted[0];

	// [RH] ZDoom now uses Hexen-style maps as its native format.
	//		Since this is the only place where Doom-style Things are ever
	//		referenced, we translate them into a Hexen-style thing.
	for (int i=0 ; i < numthings; i++, mt++)
	{
		// [RH] At this point, monsters unique to Doom II were weeded out
		//		if the IWAD wasn't for Doom II. P_SpawnMapThing() can now
		//		handle these and more cases better, so we just pass it
		//		everything and let it decide what to do with them.

		// [RH] Need to translate the spawn flags to Hexen format.
		short flags = LittleShort(mt->options);

		memset (&mti[i], 0, sizeof(mti[i]));

		mti[i].Gravity = 1;
		mti[i].Conversation = 0;
		mti[i].SkillFilter = MakeSkill(flags);
		mti[i].ClassFilter = 0xffff;	// Doom map format doesn't have class flags so spawn for all player classes
		mti[i].RenderStyle = STYLE_Count;
		mti[i].Alpha = -1;
		mti[i].health = 1;
		mti[i].FloatbobPhase = -1;

		mti[i].pos.X = LittleShort(mt->x);
		mti[i].pos.Y = LittleShort(mt->y);
		mti[i].angle = LittleShort(mt->angle);
		mti[i].EdNum = LittleShort(mt->type);
		mti[i].info = DoomEdMap.CheckKey(mti[i].EdNum);


#ifndef NO_EDATA
		if (mti[i].info != NULL && mti[i].info->Special == SMT_EDThing)
		{
			ProcessEDMapthing(&mti[i], flags);
		}
		else
#endif
		{
			flags &= ~MTF_SKILLMASK;
			mti[i].flags = (short)((flags & 0xf) | 0x7e0);
			if (gameinfo.gametype == GAME_Strife)
			{
				mti[i].flags &= ~MTF_AMBUSH;
				if (flags & STF_SHADOW)			mti[i].flags |= MTF_SHADOW;
				if (flags & STF_ALTSHADOW)		mti[i].flags |= MTF_ALTSHADOW;
				if (flags & STF_STANDSTILL)		mti[i].flags |= MTF_STANDSTILL;
				if (flags & STF_AMBUSH)			mti[i].flags |= MTF_AMBUSH;
				if (flags & STF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			else
			{
				if (flags & BTF_BADEDITORCHECK)
				{
					flags &= 0x1F;
				}
				if (flags & BTF_NOTDEATHMATCH)	mti[i].flags &= ~MTF_DEATHMATCH;
				if (flags & BTF_NOTCOOPERATIVE)	mti[i].flags &= ~MTF_COOPERATIVE;
				if (flags & BTF_FRIENDLY)		mti[i].flags |= MTF_FRIENDLY;
			}
			if (flags & BTF_NOTSINGLE)			mti[i].flags &= ~MTF_SINGLE;
		}
	}
	delete [] mtp;
}